

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetPchFileObject
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  _Base_ptr source;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  int iVar4;
  long *plVar5;
  mapped_type *pmVar6;
  undefined4 extraout_var;
  ulong *puVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar8;
  string pchSource;
  string local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_88;
  string *local_60;
  _Base_ptr local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = std::__cxx11::string::compare((char *)language);
  if ((((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)language), iVar4 != 0)) &&
      (iVar4 = std::__cxx11::string::compare((char *)language), iVar4 != 0)) &&
     (iVar4 = std::__cxx11::string::compare((char *)language), iVar4 != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_60 = config;
  std::operator+(&local_50,language,config);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(arch->_M_dataplus)._M_p);
  paVar2 = &local_a8.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_a8.field_2._M_allocated_capacity = *puVar7;
    local_a8.field_2._8_8_ = plVar5[3];
    local_a8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *puVar7;
    local_a8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_88.first._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == paVar2) {
    local_88.first.field_2._8_8_ = local_a8.field_2._8_8_;
  }
  else {
    local_88.first._M_dataplus._M_p = local_a8._M_dataplus._M_p;
  }
  local_88.first.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity =
       local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_88.second = "";
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  pVar8 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchObjectFiles,&local_88);
  local_58 = (_Base_ptr)pVar8.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
    operator_delete(local_88.first._M_dataplus._M_p,local_88.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    GetPchSource(&local_a8,this,local_60,language,arch);
    sVar3 = local_a8._M_string_length;
    if (local_a8._M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      local_88.first._M_dataplus._M_p =
           (pointer)cmMakefile::GetOrCreateSource(this->Makefile,&local_a8,false,Known);
      pcVar1 = (this->ObjectDirectory)._M_dataplus._M_p;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->ObjectDirectory)._M_string_length;
      ComputeObjectMapping(this);
      pmVar6 = std::
               map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->Objects,(key_type *)&local_88);
      local_88.first.field_2._8_8_ = (pmVar6->_M_dataplus)._M_p;
      local_88.first.field_2._M_allocated_capacity = pmVar6->_M_string_length;
      views._M_len = 2;
      views._M_array = (iterator)&local_88;
      local_88.first._M_dataplus._M_p = (pointer)paVar2;
      local_88.first._M_string_length = (size_type)pcVar1;
      cmCatViews_abi_cxx11_(&local_50,views);
      source = local_58 + 2;
      std::__cxx11::string::operator=((string *)source,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
      if ((char)iVar4 != '\0') {
        iVar4 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x15])();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,(char *)CONCAT44(extraout_var,iVar4),
                   (allocator<char> *)&local_50);
        cmsys::SystemTools::ReplaceString((string *)source,&local_88.first,local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
          operator_delete(local_88.first._M_dataplus._M_p,
                          local_88.first.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (sVar3 == 0) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(local_58 + 2),
             (long)&(local_58[2]._M_parent)->_M_color + *(long *)(local_58 + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchFileObject(const std::string& config,
                                                const std::string& language,
                                                const std::string& arch)
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchObjectFiles.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchSource = this->GetPchSource(config, language, arch);
    if (pchSource.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    auto* pchSf = this->Makefile->GetOrCreateSource(
      pchSource, false, cmSourceFileLocationKind::Known);

    filename = cmStrCat(this->ObjectDirectory, this->GetObjectName(pchSf));
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      cmSystemTools::ReplaceString(
        filename, this->GetGlobalGenerator()->GetCMakeCFGIntDir(), config);
    }
  }
  return inserted.first->second;
}